

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(OneHotEncoder *a,OneHotEncoder *b)

{
  uint32 uVar1;
  bool bVar2;
  Int64Vector *a_00;
  Int64Vector *b_00;
  StringVector *a_01;
  StringVector *b_01;
  
  uVar1 = a->_oneof_case_[0];
  if (uVar1 != b->_oneof_case_[0]) {
    return false;
  }
  if (uVar1 == 1) {
    a_01 = OneHotEncoder::stringcategories(a);
    b_01 = OneHotEncoder::stringcategories(b);
    bVar2 = operator!=(a_01,b_01);
  }
  else {
    if (uVar1 != 2) goto LAB_005816b5;
    a_00 = OneHotEncoder::int64categories(a);
    b_00 = OneHotEncoder::int64categories(b);
    bVar2 = operator!=(a_00,b_00);
  }
  if (bVar2 != false) {
    return false;
  }
LAB_005816b5:
  if (a->outputsparse_ != b->outputsparse_) {
    return false;
  }
  return a->handleunknown_ == b->handleunknown_;
}

Assistant:

inline OneHotEncoder::CategoryTypeCase OneHotEncoder::CategoryType_case() const {
  return OneHotEncoder::CategoryTypeCase(_oneof_case_[0]);
}